

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::reserve_source(CTcTokenizer *this,size_t len)

{
  CTcTokSrcBlock *pCVar1;
  
  if (this->src_rem_ < len + 1) {
    if (50000 < len + 1) {
      throw_fatal_error(0x2744,50000);
    }
    pCVar1 = (CTcTokSrcBlock *)operator_new(0xc358);
    pCVar1->nxt_ = (CTcTokSrcBlock *)0x0;
    this->src_cur_->nxt_ = pCVar1;
    this->src_cur_ = pCVar1;
    this->src_rem_ = 50000;
    this->src_ptr_ = pCVar1->buf_;
  }
  return;
}

Assistant:

void CTcTokenizer::reserve_source(size_t len)
{
    /* 
     *   if we don't have enough space for this line in the current source
     *   block, start a new block 
     */
    if (len + 1 > src_rem_)
    {
        CTcTokSrcBlock *blk;

        /* 
         *   if the line is too long for a source block, throw a fatal
         *   error 
         */
        if (len + 1 > TCTOK_SRC_BLOCK_SIZE)
            throw_fatal_error(TCERR_SRCLINE_TOO_LONG,
                              (long)TCTOK_SRC_BLOCK_SIZE);

        /* allocate a new block */
        blk = new CTcTokSrcBlock();

        /* link it into our list */
        src_cur_->set_next(blk);

        /* it's now the current block */
        src_cur_ = blk;

        /* start writing at the start of this block */
        src_rem_ = TCTOK_SRC_BLOCK_SIZE;
        src_ptr_ = blk->get_buf();
    }
}